

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O3

string * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::Gen1ViolMax_abi_cxx11_(string *__return_storage_ptr__,void *this,bool f_max,double viol,char *nm)

{
  char *pcVar1;
  size_t sVar2;
  int __fd;
  MemoryWriter wrt;
  char *local_268;
  undefined8 uStack_260;
  BasicWriter<char> local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  local_258.buffer_ = &local_248;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_248.size_ = 0;
  local_248.capacity_ = 500;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  local_248.ptr_ = local_228;
  if (0.0 < viol) {
    if (f_max) {
      local_268 = (char *)viol;
      fmt::BasicWriter<char>::write(&local_258,0x49eafb,(void *)0x8,(size_t)&local_268);
    }
    if ((nm != (char *)0x0) && (*nm != '\0')) {
      __fd = 0x49f289;
      if (f_max) {
        __fd = 0x49f288;
      }
      local_268 = (char *)0x0;
      uStack_260 = 0;
      fmt::BasicWriter<char>::write(&local_258,__fd,(void *)0x0,(size_t)&local_268);
      local_268 = nm;
      fmt::BasicWriter<char>::write(&local_258,0x4bc0f6,(void *)0xa,(size_t)&local_268);
    }
  }
  sVar2 = (local_258.buffer_)->size_;
  if (sVar2 == 0) {
    local_268 = (char *)0x0;
    uStack_260 = 0;
    fmt::BasicWriter<char>::write(&local_258,0x4bd7a1,(void *)0x0,(size_t)&local_268);
    sVar2 = (local_258.buffer_)->size_;
  }
  pcVar1 = (local_258.buffer_)->ptr_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_005c3958;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_005c39a0;
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Gen1ViolMax(
      bool f_max, double viol, const char* nm) {
    fmt::MemoryWriter wrt;
    if (viol>0.0) {
      if (f_max)
        wrt.write("{:.0E}", viol);
      if (nm && *nm != '\0') {
        wrt.write(f_max ? " [" : "[");
        wrt.write("{}]", nm);
      }
    }
    if (0 == wrt.size())
      wrt.write("-");
    return wrt.str();
  }